

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::ReorderingBuffer::append
          (ReorderingBuffer *this,UChar *s,int32_t length,UBool isNFD,uint8_t leadCC,uint8_t trailCC
          ,UErrorCode *errorCode)

{
  Normalizer2Impl *this_00;
  UBool UVar1;
  uint8_t cc;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  UChar *pUVar6;
  UChar *pUVar7;
  uint uVar8;
  
  if (length == 0) {
    return '\x01';
  }
  iVar3 = this->remainingCapacity;
  if (iVar3 < length) {
    UVar1 = resize(this,length,errorCode);
    if (UVar1 == '\0') {
      return '\0';
    }
    iVar3 = this->remainingCapacity;
  }
  this->remainingCapacity = iVar3 - length;
  if ((leadCC != '\0') && (leadCC < this->lastCC)) {
    uVar8 = (uint)(ushort)*s;
    iVar3 = 1;
    if ((length != 1 && (uVar8 & 0xfc00) == 0xd800) && (((ushort)s[1] & 0xfc00) == 0xdc00)) {
      uVar8 = (uint)(ushort)*s * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
      iVar3 = 2;
    }
    insert(this,uVar8,leadCC);
    while (iVar3 < length) {
      iVar4 = iVar3 + 1;
      uVar8 = (uint)(ushort)s[iVar3];
      if ((iVar4 != length && (uVar8 & 0xfc00) == 0xd800) &&
         (lVar5 = (long)iVar4, ((ushort)s[lVar5] & 0xfc00) == 0xdc00)) {
        iVar4 = iVar3 + 2;
        uVar8 = (uint)(ushort)s[iVar3] * 0x400 + (uint)(ushort)s[lVar5] + 0xfca02400;
      }
      cc = trailCC;
      if (iVar4 < length) {
        this_00 = this->impl;
        if (isNFD == '\0') {
          uVar2 = Normalizer2Impl::getNorm16(this_00,uVar8);
          cc = Normalizer2Impl::getCC(this_00,uVar2);
        }
        else {
          uVar2 = Normalizer2Impl::getRawNorm16(this_00,uVar8);
          cc = (uint8_t)(uVar2 >> 1);
          if (uVar2 < 0xfc00) {
            cc = '\0';
          }
        }
      }
      append(this,uVar8,cc,errorCode);
      iVar3 = iVar4;
    }
    return '\x01';
  }
  if (trailCC < 2) {
    pUVar6 = this->limit;
    pUVar7 = pUVar6 + length;
  }
  else {
    pUVar6 = this->limit;
    if (1 < leadCC) goto LAB_0027e4fe;
    pUVar7 = pUVar6 + 1;
  }
  this->reorderStart = pUVar7;
LAB_0027e4fe:
  lVar5 = 0;
  do {
    *(undefined2 *)((long)pUVar6 + lVar5) = *(undefined2 *)((long)s + lVar5);
    lVar5 = lVar5 + 2;
  } while ((long)length * 2 != lVar5);
  this->limit = (UChar *)((long)pUVar6 + lVar5);
  this->lastCC = trailCC;
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::append(const UChar *s, int32_t length, UBool isNFD,
                               uint8_t leadCC, uint8_t trailCC,
                               UErrorCode &errorCode) {
    if(length==0) {
        return TRUE;
    }
    if(remainingCapacity<length && !resize(length, errorCode)) {
        return FALSE;
    }
    remainingCapacity-=length;
    if(lastCC<=leadCC || leadCC==0) {
        if(trailCC<=1) {
            reorderStart=limit+length;
        } else if(leadCC<=1) {
            reorderStart=limit+1;  // Ok if not a code point boundary.
        }
        const UChar *sLimit=s+length;
        do { *limit++=*s++; } while(s!=sLimit);
        lastCC=trailCC;
    } else {
        int32_t i=0;
        UChar32 c;
        U16_NEXT(s, i, length, c);
        insert(c, leadCC);  // insert first code point
        while(i<length) {
            U16_NEXT(s, i, length, c);
            if(i<length) {
                if (isNFD) {
                    leadCC = Normalizer2Impl::getCCFromYesOrMaybe(impl.getRawNorm16(c));
                } else {
                    leadCC = impl.getCC(impl.getNorm16(c));
                }
            } else {
                leadCC=trailCC;
            }
            append(c, leadCC, errorCode);
        }
    }
    return TRUE;
}